

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  bool formattable_4;
  bool formattable_pointer_4;
  bool formattable_char_4;
  bool formattable_3;
  bool formattable_pointer_3;
  bool formattable_char_3;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_char_2;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  undefined1 local_279;
  char *local_278;
  size_t local_270;
  undefined1 local_263;
  undefined1 local_262;
  undefined1 local_261;
  char *local_258 [3];
  undefined1 local_239;
  char *local_238;
  size_t local_230;
  undefined1 local_223;
  undefined1 local_222;
  undefined1 local_221;
  char *local_218 [3];
  undefined1 local_1f9;
  char *local_1f8;
  size_t local_1f0;
  undefined1 local_1e3;
  undefined1 local_1e2;
  undefined1 local_1e1;
  char *local_1d8 [3];
  undefined1 local_1b9;
  char *local_1b8;
  size_t local_1b0;
  undefined1 local_1a3;
  undefined1 local_1a2;
  undefined1 local_1a1;
  char *local_198 [3];
  undefined1 local_179;
  char *local_178;
  size_t local_170;
  undefined1 local_163;
  undefined1 local_162;
  undefined1 local_161;
  char *local_158 [3];
  undefined1 *local_140;
  basic_string_view<char> local_138;
  undefined1 *local_120;
  basic_string_view<char> local_118;
  undefined1 *local_100;
  basic_string_view<char> local_f8;
  undefined1 *local_e0;
  basic_string_view<char> local_d8;
  undefined1 *local_c0;
  basic_string_view<char> local_b8;
  char **local_a8;
  basic_string_view<char> local_a0;
  char **local_90;
  basic_string_view<char> local_88;
  char **local_78;
  basic_string_view<char> local_70;
  char **local_60;
  basic_string_view<char> local_58;
  char **local_48;
  basic_string_view<char> local_40 [4];
  
  local_161 = 1;
  local_162 = 1;
  local_163 = 1;
  local_140 = &local_179;
  local_138 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x298ae5);
  local_178 = local_138.data_;
  local_170 = local_138.size_;
  local_a0.data_ = local_138.data_;
  local_a0.size_ = local_138.size_;
  local_a8 = local_158;
  local_158[0] = basic_string_view<char>::data(&local_a0);
  sVar1 = basic_string_view<char>::size(&local_a0);
  local_1a1 = 1;
  local_1a2 = 1;
  local_1a3 = 1;
  local_120 = &local_1b9;
  local_118 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x298bfa);
  local_1b8 = local_118.data_;
  local_1b0 = local_118.size_;
  local_88.data_ = local_118.data_;
  local_88.size_ = local_118.size_;
  local_90 = local_198;
  local_198[0] = basic_string_view<char>::data(&local_88);
  sVar2 = basic_string_view<char>::size(&local_88);
  local_1e1 = 1;
  local_1e2 = 1;
  local_1e3 = 1;
  local_100 = &local_1f9;
  local_f8 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x298d0f);
  local_1f8 = local_f8.data_;
  local_1f0 = local_f8.size_;
  local_70.data_ = local_f8.data_;
  local_70.size_ = local_f8.size_;
  local_78 = local_1d8;
  local_1d8[0] = basic_string_view<char>::data(&local_70);
  sVar3 = basic_string_view<char>::size(&local_70);
  local_221 = 1;
  local_222 = 1;
  local_223 = 1;
  local_e0 = &local_239;
  local_d8 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x298e24);
  local_238 = local_d8.data_;
  local_230 = local_d8.size_;
  local_58.data_ = local_d8.data_;
  local_58.size_ = local_d8.size_;
  local_60 = local_218;
  local_218[0] = basic_string_view<char>::data(&local_58);
  sVar4 = basic_string_view<char>::size(&local_58);
  local_261 = 1;
  local_262 = 1;
  local_263 = 1;
  local_c0 = &local_279;
  local_b8 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x298f39);
  local_278 = local_b8.data_;
  local_270 = local_b8.size_;
  local_40[0].data_ = local_b8.data_;
  local_40[0].size_ = local_b8.size_;
  local_48 = local_258;
  local_258[0] = basic_string_view<char>::data(local_40);
  sVar5 = basic_string_view<char>::size(local_40);
  (in_RDI->data_).args_[0].field_0.string.data = local_158[0];
  (in_RDI->data_).args_[0].field_0.string.size = sVar1;
  (in_RDI->data_).args_[1].field_0.string.data = local_198[0];
  (in_RDI->data_).args_[1].field_0.string.size = sVar2;
  (in_RDI->data_).args_[2].field_0.string.data = local_1d8[0];
  (in_RDI->data_).args_[2].field_0.string.size = sVar3;
  (in_RDI->data_).args_[3].field_0.string.data = local_218[0];
  (in_RDI->data_).args_[3].field_0.string.size = sVar4;
  (in_RDI->data_).args_[4].field_0.string.data = local_258[0];
  (in_RDI->data_).args_[4].field_0.string.size = sVar5;
  return in_RDI;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}